

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
roundTripString_testRoundTrip_Test::TestBody(roundTripString_testRoundTrip_Test *this)

{
  ParamType *pPVar1;
  uint64_t uVar2;
  precise_unit *un;
  uint64_t in_RCX;
  char *message;
  AssertHelper AStack_a8;
  precise_unit local_a0;
  AssertionResult gtest_ar;
  string local_80;
  string local_60;
  precise_unit u1;
  string str;
  
  pPVar1 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::string((string *)&local_60,(string *)pPVar1);
  uVar2 = units::getDefaultFlags();
  u1 = units::unit_from_string(&local_60,uVar2);
  std::__cxx11::string::~string((string *)&local_60);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&str,(units *)&u1,un,in_RCX);
  std::__cxx11::string::string((string *)&local_80,(string *)&str);
  uVar2 = units::getDefaultFlags();
  local_a0 = units::unit_from_string(&local_80,uVar2);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"unit_from_string(str)","u1",&local_a0,&u1);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    std::operator<<((ostream *)((long)local_a0.multiplier_ + 0x10),
                    "Round trip string didn\'t match ");
    pPVar1 = testing::
             WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::GetParam();
    std::operator<<((ostream *)((long)local_a0.multiplier_ + 0x10),(string *)pPVar1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3dc,message);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    if ((long *)local_a0.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_a0.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST_P(roundTripString, testRoundTrip)
{
    auto u1 = unit_from_string(GetParam());
    auto str = to_string(u1);
    EXPECT_EQ(unit_from_string(str), u1)
        << "Round trip string didn't match " << GetParam();
}